

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_message.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::csharp::MessageGenerator::class_name_abi_cxx11_
          (string *__return_storage_ptr__,MessageGenerator *this)

{
  long *plVar1;
  long lVar2;
  
  plVar1 = *(long **)(this->descriptor_ + 8);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  lVar2 = *plVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,lVar2,plVar1[1] + lVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string MessageGenerator::class_name() {
  return std::string(descriptor_->name());
}